

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentLexer.cxx
# Opt level: O1

yy_state_type yy_get_previous_state(yyscan_t yyscanner)

{
  short *psVar1;
  uint uVar2;
  byte *pbVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar2 = *(uint *)((long)yyscanner + 0x4c);
  pbVar3 = *(byte **)((long)yyscanner + 0x80);
  if (pbVar3 < *(byte **)((long)yyscanner + 0x40)) {
    do {
      if ((ulong)*pbVar3 == 0) {
        bVar4 = 1;
      }
      else {
        bVar4 = ""[*pbVar3];
      }
      if ((0x2a4c007fUL >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
        *(uint *)((long)yyscanner + 0x68) = uVar2;
        *(byte **)((long)yyscanner + 0x70) = pbVar3;
      }
      uVar5 = (ulong)(int)uVar2;
      uVar6 = (ulong)bVar4;
      lVar7 = (long)yy_base[uVar5] + uVar6;
      if (uVar2 != (int)yy_chk[lVar7]) {
        do {
          if ((0x668f00UL >> (uVar5 & 0x3f) & 1) != 0) {
            bVar4 = ""[uVar6];
          }
          psVar1 = yy_def + uVar5;
          uVar5 = (ulong)*psVar1;
          uVar6 = (ulong)bVar4;
          lVar7 = (long)yy_base[uVar5] + uVar6;
        } while (*psVar1 != yy_chk[lVar7]);
      }
      uVar2 = (uint)yy_nxt[lVar7];
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != *(byte **)((long)yyscanner + 0x40));
  }
  return uVar2;
}

Assistant:

static yy_state_type yy_get_previous_state (yyscan_t yyscanner)
{
	yy_state_type yy_current_state;
	char *yy_cp;
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

	yy_current_state = yyg->yy_start;

	for ( yy_cp = yyg->yytext_ptr + YY_MORE_ADJ; yy_cp < yyg->yy_c_buf_p; ++yy_cp )
		{
		YY_CHAR yy_c = (*yy_cp ? yy_ec[YY_SC_TO_UI(*yy_cp)] : 1);
		if ( yy_accept[yy_current_state] )
			{
			yyg->yy_last_accepting_state = yy_current_state;
			yyg->yy_last_accepting_cpos = yy_cp;
			}
		while ( yy_chk[yy_base[yy_current_state] + yy_c] != yy_current_state )
			{
			yy_current_state = (int) yy_def[yy_current_state];
			if ( yy_current_state >= 30 )
				yy_c = yy_meta[yy_c];
			}
		yy_current_state = yy_nxt[yy_base[yy_current_state] + yy_c];
		}

	return yy_current_state;
}